

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  
  copy_suite::run();
  count_suite::count_full();
  count_suite::count_if_full();
  fill_suite::expand_fill_n_full();
  fill_suite::back_inserter_fill_n_full();
  find_suite::run();
  predicate_suite::test_all_of();
  predicate_suite::test_any_of();
  predicate_suite::test_none_of();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    copy_suite::run();
    count_suite::run();
    fill_suite::run();
    find_suite::run();
    predicate_suite::run();

    return boost::report_errors();
}